

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O0

bool __thiscall
draco::RAnsSymbolEncoder<18>::ProbabilityLess::operator()(ProbabilityLess *this,int i,int j)

{
  uint uVar1;
  const_reference pvVar2;
  vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  
  pvVar2 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::at
                     (in_RDI,in_stack_ffffffffffffffd8);
  uVar1 = pvVar2->prob;
  pvVar2 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::at
                     (in_RDI,in_stack_ffffffffffffffd8);
  return uVar1 < pvVar2->prob;
}

Assistant:

bool operator()(int i, int j) const {
      return probabilities->at(i).prob < probabilities->at(j).prob;
    }